

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O3

void __thiscall mir::inst::PtrOffsetInst::replace(PtrOffsetInst *this,VarId *from,VarId *to)

{
  if ((this->ptr).id == from->id) {
    (this->ptr).id = to->id;
  }
  if (((this->offset).field_0x18 == '\x01') && (*(uint32_t *)&(this->offset).field_0x10 == from->id)
     ) {
    *(uint32_t *)&(this->offset).field_0x10 = to->id;
  }
  return;
}

Assistant:

VarId& operator=(const VarId& other) = default;